

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

void google::protobuf::StrAppend(string *result,AlphaNum *a,AlphaNum *b)

{
  size_type sVar1;
  pointer pcVar2;
  size_t sVar3;
  LogMessage *pLVar4;
  pointer __dest;
  LogFinisher local_d9;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((ulong)((long)a->piece_data_ - (long)(result->_M_dataplus)._M_p) <= result->_M_string_length)
  {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x62f);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: (uintptr_t((a).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if ((ulong)((long)b->piece_data_ - (long)(result->_M_dataplus)._M_p) <= result->_M_string_length)
  {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x630);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_a0,
                        "CHECK failed: (uintptr_t((b).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar4);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  sVar1 = result->_M_string_length;
  std::__cxx11::string::resize
            ((ulong)result,(char)a->piece_size_ + (char)sVar1 + (char)b->piece_size_);
  pcVar2 = (result->_M_dataplus)._M_p;
  __dest = pcVar2 + sVar1;
  memcpy(__dest,a->piece_data_,a->piece_size_);
  sVar3 = a->piece_size_;
  memcpy(__dest + sVar3,b->piece_data_,b->piece_size_);
  if (__dest + sVar3 + b->piece_size_ != pcVar2 + result->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x635);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_d8,"CHECK failed: (out) == (begin + result->size()): ");
    internal::LogFinisher::operator=(&local_d9,pLVar4);
    internal::LogMessage::~LogMessage(&local_d8);
  }
  return;
}

Assistant:

void StrAppend(string *result, const AlphaNum &a, const AlphaNum &b) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  GOOGLE_DCHECK_NO_OVERLAP(*result, b);
  string::size_type old_size = result->size();
  result->resize(old_size + a.size() + b.size());
  char *const begin = &*result->begin();
  char *out = Append2(begin + old_size, a, b);
  GOOGLE_DCHECK_EQ(out, begin + result->size());
}